

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest.cc
# Opt level: O2

void gflags::anon_unknown_5::Test_FlagSaverTest_CanSaveStringFlagStates::Run(void)

{
  bool bVar1;
  char *pcVar2;
  FlagSettingMode in_R8D;
  char *pcVar3;
  FlagSaver fs;
  FlagSaver fs_1;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  FlagSaver::FlagSaver(&fs);
  fprintf(_stderr,"Running test %s/%s\n","FlagSaverTest");
  SetCommandLineOptionWithMode_abi_cxx11_(&local_28,(gflags *)0x14b43b,"second",(char *)0x0,in_R8D);
  std::__cxx11::string::~string((string *)&local_28);
  SetCommandLineOptionWithMode_abi_cxx11_(&local_48,(gflags *)0x14b462,"second",(char *)0x2,in_R8D);
  std::__cxx11::string::~string((string *)&local_48);
  FlagSaver::FlagSaver(&fs_1);
  SetCommandLineOptionWithMode_abi_cxx11_(&local_68,(gflags *)0x14b406,"second",(char *)0x0,in_R8D);
  std::__cxx11::string::~string((string *)&local_68);
  bVar1 = std::operator==("second",fLS::FLAGS_test_str1_abi_cxx11_);
  if (bVar1) {
    SetCommandLineOptionWithMode_abi_cxx11_(&local_88,(gflags *)0x14b43b,"third",(char *)0x2,in_R8D)
    ;
    std::__cxx11::string::~string((string *)&local_88);
    bVar1 = std::operator==("second",fLS::FLAGS_test_str2_abi_cxx11_);
    if (bVar1) {
      SetCommandLineOptionWithMode_abi_cxx11_
                (&local_a8,(gflags *)0x14b462,"third",(char *)0x0,in_R8D);
      std::__cxx11::string::~string((string *)&local_a8);
      bVar1 = std::operator==("third",fLS::FLAGS_test_str3_abi_cxx11_);
      if (!bVar1) {
        pcVar2 = "\"third\"";
LAB_001362a3:
        pcVar3 = "FLAGS_test_str3";
        goto LAB_001362b1;
      }
      FlagSaver::~FlagSaver(&fs_1);
      bVar1 = std::operator==("initial",fLS::FLAGS_test_str1_abi_cxx11_);
      if (!bVar1) {
        pcVar2 = "\"initial\"";
        goto LAB_0013626f;
      }
      SetCommandLineOptionWithMode_abi_cxx11_
                ((string *)&fs_1,(gflags *)0x14b406,"second",(char *)0x1,in_R8D);
      std::__cxx11::string::~string((string *)&fs_1);
      bVar1 = std::operator==("second",fLS::FLAGS_test_str1_abi_cxx11_);
      if (!bVar1) goto LAB_00136238;
      bVar1 = std::operator==("second",fLS::FLAGS_test_str2_abi_cxx11_);
      if (bVar1) {
        SetCommandLineOptionWithMode_abi_cxx11_
                  (&local_c8,(gflags *)0x14b43b,"fourth",(char *)0x1,in_R8D);
        std::__cxx11::string::~string((string *)&local_c8);
        bVar1 = std::operator==("second",fLS::FLAGS_test_str2_abi_cxx11_);
        if (bVar1) {
          bVar1 = std::operator==("second",fLS::FLAGS_test_str3_abi_cxx11_);
          if (bVar1) {
            SetCommandLineOptionWithMode_abi_cxx11_
                      (&local_e8,(gflags *)0x14b462,"fourth",(char *)0x1,in_R8D);
            std::__cxx11::string::~string((string *)&local_e8);
            bVar1 = std::operator==("fourth",fLS::FLAGS_test_str3_abi_cxx11_);
            if (bVar1) {
              FlagSaver::~FlagSaver(&fs);
              return;
            }
            pcVar2 = "\"fourth\"";
          }
          else {
            pcVar2 = "\"second\"";
          }
          goto LAB_001362a3;
        }
      }
    }
    pcVar2 = "\"second\"";
    pcVar3 = "FLAGS_test_str2";
  }
  else {
LAB_00136238:
    pcVar2 = "\"second\"";
LAB_0013626f:
    pcVar3 = "FLAGS_test_str1";
  }
LAB_001362b1:
  fprintf(_stderr,"Check failed: %s %s %s\n",pcVar2,"==",pcVar3);
  exit(1);
}

Assistant:

TEST(FlagSaverTest, CanSaveStringFlagStates) {
  // 1. Initializes the flags.

  // State of flag test_str1:
  //   default value - "initial"
  //   current value - "initial"
  //   not set       - true

  SetCommandLineOptionWithMode("test_str2", "second", SET_FLAGS_VALUE);
  // State of flag test_str2:
  //   default value - "initial"
  //   current value - "second"
  //   not set       - false

  SetCommandLineOptionWithMode("test_str3", "second", SET_FLAGS_DEFAULT);
  // State of flag test_str3:
  //   default value - "second"
  //   current value - "second"
  //   not set       - true

  // 2. Saves the flag states.

  {
    FlagSaver fs;

    // 3. Modifies the flag states.

    SetCommandLineOptionWithMode("test_str1", "second", SET_FLAGS_VALUE);
    EXPECT_EQ("second", FLAGS_test_str1);
    // State of flag test_str1:
    //   default value - "second"
    //   current value - "second"
    //   not set       - true

    SetCommandLineOptionWithMode("test_str2", "third", SET_FLAGS_DEFAULT);
    EXPECT_EQ("second", FLAGS_test_str2);
    // State of flag test_str2:
    //   default value - "third"
    //   current value - "second"
    //   not set       - false

    SetCommandLineOptionWithMode("test_str3", "third", SET_FLAGS_VALUE);
    EXPECT_EQ("third", FLAGS_test_str3);
    // State of flag test_str1:
    //   default value - "second"
    //   current value - "third"
    //   not set       - false

    // 4. Restores the flag states.
  }

  // 5. Verifies that the states were restored.

  // Verifies that the value of test_str1 was restored.
  EXPECT_EQ("initial", FLAGS_test_str1);
  // Verifies that the "not set" attribute of test_str1 was restored to true.
  SetCommandLineOptionWithMode("test_str1", "second", SET_FLAG_IF_DEFAULT);
  EXPECT_EQ("second", FLAGS_test_str1);

  // Verifies that the value of test_str2 was restored.
  EXPECT_EQ("second", FLAGS_test_str2);
  // Verifies that the "not set" attribute of test_str2 was restored to false.
  SetCommandLineOptionWithMode("test_str2", "fourth", SET_FLAG_IF_DEFAULT);
  EXPECT_EQ("second", FLAGS_test_str2);

  // Verifies that the value of test_str3 was restored.
  EXPECT_EQ("second", FLAGS_test_str3);
  // Verifies that the "not set" attribute of test_str3 was restored to true.
  SetCommandLineOptionWithMode("test_str3", "fourth", SET_FLAG_IF_DEFAULT);
  EXPECT_EQ("fourth", FLAGS_test_str3);
}